

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

void __thiscall
cfd::core::AbstractTransaction::RemoveTxOut(AbstractTransaction *this,uint32_t index)

{
  CfdException *this_00;
  undefined4 in_register_00000034;
  int ret;
  int local_44;
  string local_40;
  
  (*this->_vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x228,"RemoveTxOut");
  local_44 = wally_tx_remove_output((wally_tx *)this->wally_tx_pointer_,(ulong)index);
  if (local_44 == 0) {
    return;
  }
  local_40._M_dataplus._M_p = "cfdcore_transaction_common.cpp";
  local_40._M_string_length._0_4_ = 0x22d;
  local_40.field_2._M_allocated_capacity = (long)"AddTxOut_RemoveTxOut" + 9;
  logger::log<int&>((CfdSourceLocation *)&local_40,kCfdLogLevelWarning,
                    "wally_tx_remove_output NG[{}].",&local_44);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vout remove error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::RemoveTxOut(uint32_t index) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  int ret = wally_tx_remove_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), index);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_remove_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout remove error.");
  }
}